

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

void ps_parser_skip_PS_token(PS_Parser parser)

{
  byte bVar1;
  byte *limit;
  FT_Error FVar2;
  FT_Byte *cur;
  byte *pbVar3;
  ulong uVar4;
  byte *local_18;
  
  local_18 = parser->cursor;
  limit = parser->limit;
  do {
    if ((limit <= local_18) || (uVar4 = (ulong)*local_18, 0x25 < uVar4)) break;
    pbVar3 = local_18;
    if ((0x100003601U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 != 0x25) break;
      do {
        pbVar3 = local_18;
        if ((*local_18 == 10) || (*local_18 == 0xd)) break;
        local_18 = local_18 + 1;
        pbVar3 = limit;
      } while (local_18 != limit);
    }
    local_18 = pbVar3 + 1;
  } while( true );
  FVar2 = 0;
  pbVar3 = local_18;
  if (limit <= local_18) goto LAB_00230f56;
  bVar1 = *local_18;
  if (bVar1 < 0x3e) {
    if (bVar1 == 0x28) {
      FVar2 = skip_literal_string(&local_18,limit);
      pbVar3 = local_18;
      goto LAB_00230f56;
    }
    if (bVar1 == 0x2f) {
      local_18 = local_18 + 1;
    }
    else if (bVar1 == 0x3c) {
      if ((limit <= local_18 + 1) || (local_18[1] != 0x3c)) {
        FVar2 = skip_string(&local_18,limit);
        pbVar3 = local_18;
        goto LAB_00230f56;
      }
      goto LAB_00230ef1;
    }
LAB_00230f0b:
    pbVar3 = local_18;
    if (local_18 < limit) {
      do {
        bVar1 = *local_18;
        pbVar3 = local_18;
        if ((((ulong)bVar1 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
           ((bVar1 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0))))
        break;
        local_18 = local_18 + 1;
        pbVar3 = limit;
      } while (local_18 != limit);
    }
  }
  else {
    if (0x5c < bVar1) {
      if (bVar1 == 0x7b) {
        FVar2 = skip_procedure(&local_18,limit);
        pbVar3 = local_18;
        goto LAB_00230f56;
      }
      if (bVar1 == 0x5d) goto LAB_00230ec1;
      goto LAB_00230f0b;
    }
    if (bVar1 == 0x3e) {
      pbVar3 = local_18 + 1;
      FVar2 = 3;
      if ((limit <= pbVar3) || (*pbVar3 != 0x3e)) goto LAB_00230f56;
LAB_00230ef1:
      pbVar3 = local_18 + 2;
    }
    else {
      if (bVar1 != 0x5b) goto LAB_00230f0b;
LAB_00230ec1:
      pbVar3 = local_18 + 1;
    }
  }
  local_18 = pbVar3;
  FVar2 = 0;
  pbVar3 = local_18;
LAB_00230f56:
  local_18 = pbVar3;
  if ((local_18 < limit) && (local_18 == parser->cursor)) {
    FVar2 = 3;
  }
  if (limit < local_18) {
    local_18 = limit;
  }
  parser->error = FVar2;
  parser->cursor = local_18;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_parser_skip_PS_token( PS_Parser  parser )
  {
    /* Note: PostScript allows any non-delimiting, non-whitespace        */
    /*       character in a name (PS Ref Manual, 3rd ed, p31).           */
    /*       PostScript delimiters are (, ), <, >, [, ], {, }, /, and %. */

    FT_Byte*  cur   = parser->cursor;
    FT_Byte*  limit = parser->limit;
    FT_Error  error = FT_Err_Ok;


    skip_spaces( &cur, limit );             /* this also skips comments */
    if ( cur >= limit )
      goto Exit;

    /* self-delimiting, single-character tokens */
    if ( *cur == '[' || *cur == ']' )
    {
      cur++;
      goto Exit;
    }

    /* skip balanced expressions (procedures and strings) */

    if ( *cur == '{' )                              /* {...} */
    {
      error = skip_procedure( &cur, limit );
      goto Exit;
    }

    if ( *cur == '(' )                              /* (...) */
    {
      error = skip_literal_string( &cur, limit );
      goto Exit;
    }

    if ( *cur == '<' )                              /* <...> */
    {
      if ( cur + 1 < limit && *( cur + 1 ) == '<' ) /* << */
      {
        cur++;
        cur++;
      }
      else
        error = skip_string( &cur, limit );

      goto Exit;
    }

    if ( *cur == '>' )
    {
      cur++;
      if ( cur >= limit || *cur != '>' )             /* >> */
      {
        FT_ERROR(( "ps_parser_skip_PS_token:"
                   " unexpected closing delimiter `>'\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }
      cur++;
      goto Exit;
    }

    if ( *cur == '/' )
      cur++;

    /* anything else */
    while ( cur < limit )
    {
      /* *cur might be invalid (e.g., ')' or '}'), but this   */
      /* is handled by the test `cur == parser->cursor' below */
      if ( IS_PS_DELIM( *cur ) )
        break;

      cur++;
    }

  Exit:
    if ( cur < limit && cur == parser->cursor )
    {
      FT_ERROR(( "ps_parser_skip_PS_token:"
                 " current token is `%c' which is self-delimiting\n",
                 *cur ));
      FT_ERROR(( "                        "
                 " but invalid at this point\n" ));

      error = FT_THROW( Invalid_File_Format );
    }

    if ( cur > limit )
      cur = limit;

    parser->error  = error;
    parser->cursor = cur;
  }